

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>
wasm::Builder::makeGlobal(Name name,Type type,Expression *init,Mutability mutable_)

{
  pointer pGVar1;
  __uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true> this;
  undefined4 in_register_00000084;
  int in_R9D;
  Mutability mutable__local;
  Expression *init_local;
  Type type_local;
  Name name_local;
  __single_object *glob;
  
  type_local.id = name.super_IString.str._M_str;
  this.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl = name.super_IString.str._M_len;
  std::make_unique<wasm::Global>();
  pGVar1 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                     ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                      this.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                      super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
  Name::operator=((Name *)pGVar1,(Name *)&type_local);
  pGVar1 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                     ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                      this.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                      super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
  (pGVar1->type).id = (uintptr_t)init;
  pGVar1 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                     ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                      this.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                      super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
  pGVar1->init = (Expression *)CONCAT44(in_register_00000084,mutable_);
  pGVar1 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                     ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                      this.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                      super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
  pGVar1->mutable_ = in_R9D == 0;
  return (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)
         (tuple<wasm::Global_*,_std::default_delete<wasm::Global>_>)
         this.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<Global>
  makeGlobal(Name name, Type type, Expression* init, Mutability mutable_) {
    auto glob = std::make_unique<Global>();
    glob->name = name;
    glob->type = type;
    glob->init = init;
    glob->mutable_ = mutable_ == Mutable;
    return glob;
  }